

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

FindInfo __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::find_first_non_full
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *this,size_t hash)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  uint uVar5;
  ulong uVar6;
  ulong in_RDX;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 in_ZMM0 [64];
  FindInfo FVar10;
  
  uVar2 = this->capacity_;
  uVar6 = uVar2 + 1;
  if ((uVar6 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/parallel_hashmap/phmap.h"
                  ,0x44,
                  "phmap::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                 );
  }
  uVar7 = hash >> 7 & uVar2;
  uVar8 = 0;
  auVar3 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  do {
    uVar4 = vpcmpgtb_avx512vl(auVar3,*(undefined1 (*) [16])(this->ctrl_ + uVar7));
    uVar9 = (uint)uVar4;
    if ((short)uVar4 == 0) {
      if (uVar2 <= uVar8) {
        __assert_fail("seq.index() < capacity_ && \"full table!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/parallel_hashmap/phmap.h"
                      ,0x7be,
                      "FindInfo phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, std::function<unsigned long (const std::basic_string<char> &)>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>>::find_first_non_full(size_t) [Policy = phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = std::function<unsigned long (const std::basic_string<char> &)>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, int>>]"
                     );
      }
      lVar1 = uVar8 + 0x10;
      uVar8 = uVar8 + 0x10;
      uVar7 = lVar1 + uVar7 & uVar2;
    }
    else {
      uVar5 = 0;
      for (; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x80000000) {
        uVar5 = uVar5 + 1;
      }
      uVar6 = uVar5 + uVar7 & uVar2;
      in_RDX = uVar8;
    }
  } while ((short)uVar4 == 0);
  FVar10.probe_length = in_RDX;
  FVar10.offset = uVar6;
  return FVar10;
}

Assistant:

FindInfo find_first_non_full(size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            auto mask = g.MatchEmptyOrDeleted();
            if (mask) {
                return {seq.offset(mask.LowestBitSet()), seq.index()};
            }
            assert(seq.index() < capacity_ && "full table!");
            seq.next();
        }
    }